

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu511.c
# Opt level: O0

void setup_vepu511_anti_flicker(HalH264eVepu511Ctx *ctx)

{
  uint uVar1;
  HalVepu511RegSet *pHVar2;
  rdo_skip_par *prVar3;
  rdo_noskip_par *prVar4;
  rdo_noskip_par *p_no_skip;
  rdo_skip_par *p_skip;
  RK_U32 str;
  H264eVepu511Sqi *reg;
  HalVepu511RegSet *regs;
  HalH264eVepu511Ctx *ctx_local;
  
  pHVar2 = ctx->regs_set;
  uVar1 = (ctx->cfg->tune).anti_flicker_str;
  prVar3 = &(pHVar2->reg_sqi).rdo_b16_skip;
  prVar3->atf_thd0 =
       (anon_struct_4_4_461e5c25_for_atf_thd0)
       ((uint)prVar3->atf_thd0 & 0xfffff000 | (uint)setup_vepu511_anti_flicker::pskip_atf_th0[uVar1]
       );
  prVar3->atf_thd0 =
       (anon_struct_4_4_461e5c25_for_atf_thd0)
       ((uint)prVar3->atf_thd0 & 0xf000ffff |
       (uint)setup_vepu511_anti_flicker::pskip_atf_th1[uVar1] << 0x10);
  (pHVar2->reg_sqi).rdo_b16_skip.atf_thd1 =
       (anon_struct_4_4_461f4c65_for_atf_thd1)
       ((uint)(pHVar2->reg_sqi).rdo_b16_skip.atf_thd1 & 0xfffff000 | 0xf);
  (pHVar2->reg_sqi).rdo_b16_skip.atf_thd1 =
       (anon_struct_4_4_461f4c65_for_atf_thd1)
       ((uint)(pHVar2->reg_sqi).rdo_b16_skip.atf_thd1 & 0xf000ffff | 0x190000);
  (pHVar2->reg_sqi).rdo_b16_skip.atf_wgt0 =
       (anon_struct_4_4_7529be43_for_atf_wgt0)
       ((uint)(pHVar2->reg_sqi).rdo_b16_skip.atf_wgt0 & 0xffffff00 |
       (uint)setup_vepu511_anti_flicker::pskip_atf_wgt0[uVar1]);
  (pHVar2->reg_sqi).rdo_b16_skip.atf_wgt0 =
       (anon_struct_4_4_7529be43_for_atf_wgt0)
       ((uint)(pHVar2->reg_sqi).rdo_b16_skip.atf_wgt0 & 0xffff00ff |
       (uint)setup_vepu511_anti_flicker::pskip_atf_wgt1[uVar1] << 8);
  (pHVar2->reg_sqi).rdo_b16_skip.atf_wgt0 =
       (anon_struct_4_4_7529be43_for_atf_wgt0)
       ((uint)(pHVar2->reg_sqi).rdo_b16_skip.atf_wgt0 & 0xff00ffff | 0x100000);
  (pHVar2->reg_sqi).rdo_b16_skip.atf_wgt0 =
       (anon_struct_4_4_7529be43_for_atf_wgt0)
       ((uint)(pHVar2->reg_sqi).rdo_b16_skip.atf_wgt0 & 0xffffff | 0x10000000);
  (pHVar2->reg_sqi).rdo_b16_skip.atf_wgt1 =
       (anon_struct_4_2_17bfba09_for_atf_wgt1)
       ((uint)(pHVar2->reg_sqi).rdo_b16_skip.atf_wgt1 & 0xffffff00 | 0x10);
  prVar4 = &(pHVar2->reg_sqi).rdo_b16_inter;
  prVar4->ratf_thd0 =
       (anon_struct_4_4_461e5c25_for_ratf_thd0)((uint)prVar4->ratf_thd0 & 0xfffff000 | 0x14);
  prVar4->ratf_thd0 =
       (anon_struct_4_4_461e5c25_for_ratf_thd0)((uint)prVar4->ratf_thd0 & 0xf000ffff | 0x280000);
  (pHVar2->reg_sqi).rdo_b16_inter.ratf_thd1 =
       (anon_struct_4_2_03147886_for_ratf_thd1)
       ((uint)(pHVar2->reg_sqi).rdo_b16_inter.ratf_thd1 & 0xfffff000 | 0x48);
  (pHVar2->reg_sqi).rdo_b16_inter.atf_wgt =
       (anon_struct_4_4_7529be43_for_atf_wgt)
       ((uint)(pHVar2->reg_sqi).rdo_b16_inter.atf_wgt & 0xffffff00 | 0x10);
  (pHVar2->reg_sqi).rdo_b16_inter.atf_wgt =
       (anon_struct_4_4_7529be43_for_atf_wgt)
       ((uint)(pHVar2->reg_sqi).rdo_b16_inter.atf_wgt & 0xffff00ff | 0x1000);
  (pHVar2->reg_sqi).rdo_b16_inter.atf_wgt =
       (anon_struct_4_4_7529be43_for_atf_wgt)
       ((uint)(pHVar2->reg_sqi).rdo_b16_inter.atf_wgt & 0xff00ffff | 0x100000);
  (pHVar2->reg_sqi).rdo_b16_inter.atf_wgt =
       (anon_struct_4_4_7529be43_for_atf_wgt)
       ((uint)(pHVar2->reg_sqi).rdo_b16_inter.atf_wgt & 0xffffff | 0x10000000);
  prVar4 = &(pHVar2->reg_sqi).rdo_b16_intra;
  prVar4->ratf_thd0 =
       (anon_struct_4_4_461e5c25_for_ratf_thd0)
       ((uint)prVar4->ratf_thd0 & 0xfffff000 |
       (uint)setup_vepu511_anti_flicker::intra_atf_th0[uVar1]);
  prVar4->ratf_thd0 =
       (anon_struct_4_4_461e5c25_for_ratf_thd0)
       ((uint)prVar4->ratf_thd0 & 0xf000ffff |
       (uint)setup_vepu511_anti_flicker::intra_atf_th1[uVar1] << 0x10);
  (pHVar2->reg_sqi).rdo_b16_intra.ratf_thd1 =
       (anon_struct_4_2_03147886_for_ratf_thd1)
       ((uint)(pHVar2->reg_sqi).rdo_b16_intra.ratf_thd1 & 0xfffff000 |
       (uint)setup_vepu511_anti_flicker::intra_atf_th2[uVar1]);
  (pHVar2->reg_sqi).rdo_b16_intra.atf_wgt =
       (anon_struct_4_4_7529be43_for_atf_wgt)
       ((uint)(pHVar2->reg_sqi).rdo_b16_intra.atf_wgt & 0xffffff00 |
       (uint)setup_vepu511_anti_flicker::intra_atf_wgt0[uVar1]);
  (pHVar2->reg_sqi).rdo_b16_intra.atf_wgt =
       (anon_struct_4_4_7529be43_for_atf_wgt)
       ((uint)(pHVar2->reg_sqi).rdo_b16_intra.atf_wgt & 0xffff00ff |
       (uint)setup_vepu511_anti_flicker::intra_atf_wgt1[uVar1] << 8);
  (pHVar2->reg_sqi).rdo_b16_intra.atf_wgt =
       (anon_struct_4_4_7529be43_for_atf_wgt)
       ((uint)(pHVar2->reg_sqi).rdo_b16_intra.atf_wgt & 0xff00ffff |
       (uint)setup_vepu511_anti_flicker::intra_atf_wgt2[uVar1] << 0x10);
  (pHVar2->reg_sqi).rdo_b16_intra.atf_wgt =
       (anon_struct_4_4_7529be43_for_atf_wgt)
       ((uint)(pHVar2->reg_sqi).rdo_b16_intra.atf_wgt & 0xffffff | 0x10000000);
  (pHVar2->reg_sqi).rdo_b16_intra_atf_cnt_thd =
       (anon_struct_4_8_899f6647_for_rdo_b16_intra_atf_cnt_thd)
       ((uint)(pHVar2->reg_sqi).rdo_b16_intra_atf_cnt_thd & 0xfffffff0 | 1);
  (pHVar2->reg_sqi).rdo_b16_intra_atf_cnt_thd =
       (anon_struct_4_8_899f6647_for_rdo_b16_intra_atf_cnt_thd)
       ((uint)(pHVar2->reg_sqi).rdo_b16_intra_atf_cnt_thd & 0xfffff0ff | 0x400);
  (pHVar2->reg_sqi).rdo_b16_intra_atf_cnt_thd =
       (anon_struct_4_8_899f6647_for_rdo_b16_intra_atf_cnt_thd)
       ((uint)(pHVar2->reg_sqi).rdo_b16_intra_atf_cnt_thd & 0xfff0ffff | 0x10000);
  (pHVar2->reg_sqi).rdo_b16_intra_atf_cnt_thd =
       (anon_struct_4_8_899f6647_for_rdo_b16_intra_atf_cnt_thd)
       ((uint)(pHVar2->reg_sqi).rdo_b16_intra_atf_cnt_thd & 0xf0ffffff | 0x4000000);
  (pHVar2->reg_sqi).rdo_atf_resi_thd =
       (anon_struct_4_8_443c8727_for_rdo_atf_resi_thd)
       ((uint)(pHVar2->reg_sqi).rdo_atf_resi_thd & 0xffffffc0 | 0x10);
  (pHVar2->reg_sqi).rdo_atf_resi_thd =
       (anon_struct_4_8_443c8727_for_rdo_atf_resi_thd)
       ((uint)(pHVar2->reg_sqi).rdo_atf_resi_thd & 0xffffc0ff | 0x1000);
  (pHVar2->reg_sqi).rdo_atf_resi_thd =
       (anon_struct_4_8_443c8727_for_rdo_atf_resi_thd)
       ((uint)(pHVar2->reg_sqi).rdo_atf_resi_thd & 0xffc0ffff | 0x80000);
  (pHVar2->reg_sqi).rdo_atf_resi_thd =
       (anon_struct_4_8_443c8727_for_rdo_atf_resi_thd)
       ((uint)(pHVar2->reg_sqi).rdo_atf_resi_thd & 0xc0ffffff | 0x8000000);
  return;
}

Assistant:

static void setup_vepu511_anti_flicker(HalH264eVepu511Ctx *ctx)
{
    HalVepu511RegSet *regs = ctx->regs_set;
    H264eVepu511Sqi *reg = &regs->reg_sqi;
    RK_U32 str = ctx->cfg->tune.anti_flicker_str;
    rdo_skip_par *p_skip = NULL;
    rdo_noskip_par *p_no_skip = NULL;

    static RK_U8 pskip_atf_th0[4] = { 0, 0, 0, 1 };
    static RK_U8 pskip_atf_th1[4] = { 7, 7, 7, 10 };
    static RK_U8 pskip_atf_wgt0[4] = { 16, 16, 16, 20 };
    static RK_U8 pskip_atf_wgt1[4] = { 16, 16, 14, 16 };
    static RK_U8 intra_atf_th0[4] = { 8, 16, 20, 20 };
    static RK_U8 intra_atf_th1[4] = { 16, 32, 40, 40 };
    static RK_U8 intra_atf_th2[4] = { 32, 56, 72, 72 };
    static RK_U8 intra_atf_wgt0[4] = { 16, 24, 27, 27 };
    static RK_U8 intra_atf_wgt1[4] = { 16, 22, 25, 25 };
    static RK_U8 intra_atf_wgt2[4] = { 16, 19, 20, 20 };

    p_skip = &reg->rdo_b16_skip;
    p_skip->atf_thd0.madp_thd0 = pskip_atf_th0[str];
    p_skip->atf_thd0.madp_thd1 = pskip_atf_th1[str];
    p_skip->atf_thd1.madp_thd2 = 15;
    p_skip->atf_thd1.madp_thd3 = 25;
    p_skip->atf_wgt0.wgt0 = pskip_atf_wgt0[str];
    p_skip->atf_wgt0.wgt1 = pskip_atf_wgt1[str];
    p_skip->atf_wgt0.wgt2 = 16;
    p_skip->atf_wgt0.wgt3 = 16;
    p_skip->atf_wgt1.wgt4 = 16;

    p_no_skip = &reg->rdo_b16_inter;
    p_no_skip->ratf_thd0.madp_thd0 = 20;
    p_no_skip->ratf_thd0.madp_thd1 = 40;
    p_no_skip->ratf_thd1.madp_thd2 = 72;
    p_no_skip->atf_wgt.wgt0 = 16;
    p_no_skip->atf_wgt.wgt1 = 16;
    p_no_skip->atf_wgt.wgt2 = 16;
    p_no_skip->atf_wgt.wgt3 = 16;

    p_no_skip = &reg->rdo_b16_intra;
    p_no_skip->ratf_thd0.madp_thd0 = intra_atf_th0[str];
    p_no_skip->ratf_thd0.madp_thd1 = intra_atf_th1[str];
    p_no_skip->ratf_thd1.madp_thd2 = intra_atf_th2[str];
    p_no_skip->atf_wgt.wgt0 = intra_atf_wgt0[str];
    p_no_skip->atf_wgt.wgt1 = intra_atf_wgt1[str];
    p_no_skip->atf_wgt.wgt2 = intra_atf_wgt2[str];
    p_no_skip->atf_wgt.wgt3 = 16;

    reg->rdo_b16_intra_atf_cnt_thd.thd0 = 1;
    reg->rdo_b16_intra_atf_cnt_thd.thd1 = 4;
    reg->rdo_b16_intra_atf_cnt_thd.thd2 = 1;
    reg->rdo_b16_intra_atf_cnt_thd.thd3 = 4;

    reg->rdo_atf_resi_thd.big_th0 = 16;
    reg->rdo_atf_resi_thd.big_th1 = 16;
    reg->rdo_atf_resi_thd.small_th0 = 8;
    reg->rdo_atf_resi_thd.small_th1 = 8;
}